

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O3

ssize_t __thiscall rw::TGAHeader::write(TGAHeader *this,int __fd,void *__buf,size_t __n)

{
  int32 iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  Stream *this_00;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  Stream::writeI8(this_00,this->IDlen);
  Stream::writeI8(this_00,this->colorMapType);
  Stream::writeI8(this_00,this->imageType);
  Stream::writeI16(this_00,this->colorMapOrigin);
  Stream::writeI16(this_00,this->colorMapLength);
  Stream::writeI8(this_00,this->colorMapDepth);
  Stream::writeI16(this_00,this->xOrigin);
  Stream::writeI16(this_00,this->yOrigin);
  Stream::writeI16(this_00,this->width);
  Stream::writeI16(this_00,this->height);
  Stream::writeU8(this_00,this->depth);
  iVar1 = Stream::writeU8(this_00,this->descriptor);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void
TGAHeader::write(Stream *stream)
{
	stream->writeI8(IDlen);
	stream->writeI8(colorMapType);
	stream->writeI8(imageType);
	stream->writeI16(colorMapOrigin);
	stream->writeI16(colorMapLength);
	stream->writeI8(colorMapDepth);
	stream->writeI16(xOrigin);
	stream->writeI16(yOrigin);
	stream->writeI16(width);
	stream->writeI16(height);
	stream->writeU8(depth);
	stream->writeU8(descriptor);
}